

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O2

void __thiscall Cache::printInfo(Cache *this)

{
  pointer pBVar1;
  undefined8 in_RAX;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  int i;
  ulong uVar5;
  
  puts("----------- Cache Info ------------");
  printf("Cache Size: %d bytes\n",(ulong)(this->policy).cache_size);
  printf("Block Size: %d bytes\n",(ulong)(this->policy).block_size);
  printf("Block Num: %d\n",(ulong)(this->policy).block_num);
  printf("Associativiy: %d\n",(ulong)(this->policy).associativity);
  printf("Hit Latency: %d\n",(ulong)(this->policy).hit_latency);
  lVar2 = 0;
  uVar5 = 0;
  while( true ) {
    pBVar1 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->blocks).
                       super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pBVar1) / 0x30) <= uVar5) break;
    pcVar3 = "invalid";
    pcVar4 = "unmodified";
    if ((&pBVar1->valid)[lVar2] != false) {
      pcVar3 = "valid";
    }
    if ((&pBVar1->dirty)[lVar2] != false) {
      pcVar4 = "modified";
    }
    in_RAX = CONCAT44((int)((ulong)in_RAX >> 0x20),
                      *(undefined4 *)((long)&pBVar1->last_reference + lVar2));
    printf("Block %d:\ttag 0x%x\tid %d\t%s\t%s\tlast ref %d\n",uVar5 & 0xffffffff,
           (ulong)*(uint *)((long)&pBVar1->tag + lVar2),(ulong)*(uint *)((long)&pBVar1->id + lVar2),
           pcVar3,pcVar4,in_RAX);
    uVar5 = uVar5 + 1;
    lVar2 = lVar2 + 0x30;
  }
  return;
}

Assistant:

void Cache::printInfo() {
    printf("----------- Cache Info ------------\n");
    printf("Cache Size: %d bytes\n", this->policy.cache_size);
    printf("Block Size: %d bytes\n", this->policy.block_size);
    printf("Block Num: %d\n", this->policy.block_num);
    printf("Associativiy: %d\n", this->policy.associativity);
    printf("Hit Latency: %d\n", this->policy.hit_latency);
//    printf("Miss Latency: %d\n", this->policy.miss_latency);

    for (int i = 0; i < this->blocks.size(); i++) {
        const Block &b = this->blocks[i];
        printf("Block %d:\ttag 0x%x\tid %d\t%s\t%s\tlast ref %d\n", i, b.tag, b.id,
               b.valid ? "valid" : "invalid",
               b.dirty ? "modified" : "unmodified", b.last_reference);
    }

}